

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int propagateConstantExprRewriteOne(WhereConst *pConst,Expr *pExpr,int bIgnoreAffBlob)

{
  char cVar1;
  Expr *pEVar2;
  long lVar3;
  
  if (*pConst->pOomFault == '\0') {
    if (pExpr->op != 0xa7) {
      return 0;
    }
    if ((pExpr->flags & (pConst->mExcludeOn | 0x20)) != 0) {
      return 0;
    }
    if (0 < (long)pConst->nConst) {
      lVar3 = 0;
      do {
        pEVar2 = *(Expr **)((long)pConst->apExpr + lVar3);
        if (((pEVar2 != pExpr) && (pEVar2->iTable == pExpr->iTable)) &&
           (pEVar2->iColumn == pExpr->iColumn)) {
          if ((bIgnoreAffBlob != 0) && (cVar1 = sqlite3ExprAffinity(pEVar2), cVar1 == 'A')) {
            return 1;
          }
          pConst->nChng = pConst->nChng + 1;
          pExpr->flags = pExpr->flags & 0xff7fffdf | 0x20;
          pEVar2 = *(Expr **)((long)pConst->apExpr + lVar3 + 8);
          if (pEVar2 == (Expr *)0x0) {
            pEVar2 = (Expr *)0x0;
          }
          else {
            pEVar2 = exprDup(pConst->pParse->db,pEVar2,0,(u8 **)0x0);
          }
          pExpr->pLeft = pEVar2;
          return 1;
        }
        lVar3 = lVar3 + 0x10;
      } while ((long)pConst->nConst * 0x10 != lVar3);
    }
  }
  return 1;
}

Assistant:

static int propagateConstantExprRewriteOne(
  WhereConst *pConst,
  Expr *pExpr,
  int bIgnoreAffBlob
){
  int i;
  if( pConst->pOomFault[0] ) return WRC_Prune;
  if( pExpr->op!=TK_COLUMN ) return WRC_Continue;
  if( ExprHasProperty(pExpr, EP_FixedCol|pConst->mExcludeOn) ){
    testcase( ExprHasProperty(pExpr, EP_FixedCol) );
    testcase( ExprHasProperty(pExpr, EP_OuterON) );
    testcase( ExprHasProperty(pExpr, EP_InnerON) );
    return WRC_Continue;
  }
  for(i=0; i<pConst->nConst; i++){
    Expr *pColumn = pConst->apExpr[i*2];
    if( pColumn==pExpr ) continue;
    if( pColumn->iTable!=pExpr->iTable ) continue;
    if( pColumn->iColumn!=pExpr->iColumn ) continue;
    if( bIgnoreAffBlob && sqlite3ExprAffinity(pColumn)==SQLITE_AFF_BLOB ){
      break;
    }
    /* A match is found.  Add the EP_FixedCol property */
    pConst->nChng++;
    ExprClearProperty(pExpr, EP_Leaf);
    ExprSetProperty(pExpr, EP_FixedCol);
    assert( pExpr->pLeft==0 );
    pExpr->pLeft = sqlite3ExprDup(pConst->pParse->db, pConst->apExpr[i*2+1], 0);
    if( pConst->pParse->db->mallocFailed ) return WRC_Prune;
    break;
  }
  return WRC_Prune;
}